

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_compute_frame_size_bounds
               (AV1_COMP *cpi,int frame_target,int *frame_under_shoot_limit,
               int *frame_over_shoot_limit)

{
  int local_34;
  int local_30;
  int tolerance;
  int *frame_over_shoot_limit_local;
  int *frame_under_shoot_limit_local;
  int frame_target_local;
  AV1_COMP *cpi_local;
  
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    *frame_under_shoot_limit = 0;
    *frame_over_shoot_limit = 0x7fffffff;
  }
  else {
    if (((long)(cpi->sf).hl_sf.recode_tolerance * (long)frame_target) / 100 < 100) {
      local_30 = 100;
    }
    else {
      local_30 = (int)(((long)(cpi->sf).hl_sf.recode_tolerance * (long)frame_target) / 100);
    }
    if (frame_target - local_30 < 1) {
      local_34 = 0;
    }
    else {
      local_34 = frame_target - local_30;
    }
    *frame_under_shoot_limit = local_34;
    if ((long)frame_target + (long)local_30 < (long)(cpi->rc).max_frame_bandwidth) {
      local_30 = frame_target + local_30;
    }
    else {
      local_30 = (cpi->rc).max_frame_bandwidth;
    }
    *frame_over_shoot_limit = local_30;
  }
  return;
}

Assistant:

void av1_rc_compute_frame_size_bounds(const AV1_COMP *cpi, int frame_target,
                                      int *frame_under_shoot_limit,
                                      int *frame_over_shoot_limit) {
  if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
    *frame_under_shoot_limit = 0;
    *frame_over_shoot_limit = INT_MAX;
  } else {
    // For very small rate targets where the fractional adjustment
    // may be tiny make sure there is at least a minimum range.
    assert(cpi->sf.hl_sf.recode_tolerance <= 100);
    const int tolerance = (int)AOMMAX(
        100, ((int64_t)cpi->sf.hl_sf.recode_tolerance * frame_target) / 100);
    *frame_under_shoot_limit = AOMMAX(frame_target - tolerance, 0);
    *frame_over_shoot_limit = (int)AOMMIN((int64_t)frame_target + tolerance,
                                          cpi->rc.max_frame_bandwidth);
  }
}